

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O2

int_t sLUMemXpand(int jcol,int_t next,MemType mem_type,int_t *maxlen,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int_t *piVar4;
  MemType type;
  
  type = mem_type;
  if (mem_type == USUB) {
    type = USUB;
  }
  piVar4 = (int_t *)sexpand(maxlen,type,next,(uint)(mem_type == USUB),Glu);
  if (piVar4 == (int_t *)0x0) {
    iVar1 = Glu->nzumax;
    iVar2 = Glu->nzlumax;
    iVar3 = Glu->nzlmax;
    fprintf(_stderr,"Can\'t expand MemType %d: jcol %d\n",(ulong)mem_type,(ulong)(uint)jcol);
    return iVar1 * 8 + (iVar2 + iVar3) * 4 + Glu->n * 0x29;
  }
  switch(mem_type) {
  case LUSUP:
    Glu->lusup = piVar4;
    Glu->nzlumax = *maxlen;
    break;
  case UCOL:
    Glu->ucol = piVar4;
    goto LAB_001071fb;
  case LSUB:
    Glu->lsub = piVar4;
    Glu->nzlmax = *maxlen;
    break;
  case USUB:
    Glu->usub = piVar4;
LAB_001071fb:
    Glu->nzumax = *maxlen;
  }
  return 0;
}

Assistant:

int_t
sLUMemXpand(int jcol,
	   int_t next,          /* number of elements currently in the factors */
	   MemType mem_type,  /* which type of memory to expand  */
	   int_t *maxlen,       /* modified - maximum length of a data structure */
	   GlobalLU_t *Glu    /* modified - global LU data structures */
	   )
{
    void   *new_mem;
    
#if ( DEBUGlevel>=1 ) 
    printf("sLUMemXpand[1]: jcol %d, next %lld, maxlen %lld, MemType %d\n",
	   jcol, (long long) next, (long long) *maxlen, mem_type);
#endif    

    if (mem_type == USUB) 
    	new_mem = sexpand(maxlen, mem_type, next, 1, Glu);
    else
	new_mem = sexpand(maxlen, mem_type, next, 0, Glu);
    
    if ( !new_mem ) {
	int_t    nzlmax  = Glu->nzlmax;
	int_t    nzumax  = Glu->nzumax;
	int_t    nzlumax = Glu->nzlumax;
    	fprintf(stderr, "Can't expand MemType %d: jcol %d\n", mem_type, jcol);
    	return (smemory_usage(nzlmax, nzumax, nzlumax, Glu->n) + Glu->n);
    }

    switch ( mem_type ) {
      case LUSUP:
	Glu->lusup   = (void *) new_mem;
	Glu->nzlumax = *maxlen;
	break;
      case UCOL:
	Glu->ucol   = (void *) new_mem;
	Glu->nzumax = *maxlen;
	break;
      case LSUB:
	Glu->lsub   = (int_t *) new_mem;
	Glu->nzlmax = *maxlen;
	break;
      case USUB:
	Glu->usub   = (int_t *) new_mem;
	Glu->nzumax = *maxlen;
	break;
      default: break;
    }
    
    return 0;
    
}